

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontConfig::ImFontConfig(ImFontConfig *this)

{
  void *in_RDI;
  
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x24));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x2c));
  memset(in_RDI,0,0x90);
  *(undefined1 *)((long)in_RDI + 0xc) = 1;
  *(undefined4 *)((long)in_RDI + 0x18) = 2;
  *(undefined4 *)((long)in_RDI + 0x1c) = 1;
  *(undefined4 *)((long)in_RDI + 0x44) = 0x7f7fffff;
  *(undefined4 *)((long)in_RDI + 0x50) = 0x3f800000;
  *(undefined4 *)((long)in_RDI + 0x54) = 0x3f800000;
  *(undefined2 *)((long)in_RDI + 0x58) = 0xffff;
  return;
}

Assistant:

ImFontConfig::ImFontConfig()
{
    memset(this, 0, sizeof(*this));
    FontDataOwnedByAtlas = true;
    OversampleH = 2;
    OversampleV = 1;
    GlyphMaxAdvanceX = FLT_MAX;
    RasterizerMultiply = 1.0f;
    RasterizerDensity = 1.0f;
    EllipsisChar = (ImWchar)-1;
}